

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

int prvTidySaveConfigSink(TidyDocImpl *doc,TidyOutputSink *sink)

{
  int iVar1;
  StreamOut *out_00;
  int status;
  StreamOut *out;
  uint nl;
  uint outenc;
  TidyOutputSink *sink_local;
  TidyDocImpl *doc_local;
  
  out_00 = prvTidyUserOutput(doc,sink,(int)(doc->config).value[0x3c].v,
                             (uint)(doc->config).value[0x39].v);
  iVar1 = SaveConfigToStream(doc,out_00);
  (*doc->allocator->vtbl->free)(doc->allocator,out_00);
  return iVar1;
}

Assistant:

int  TY_(SaveConfigSink)( TidyDocImpl* doc, TidyOutputSink* sink )
{
    uint outenc = cfg( doc, TidyOutCharEncoding );
    uint nl = cfg( doc, TidyNewline );
    StreamOut* out = TY_(UserOutput)( doc, sink, outenc, nl );
    int status = SaveConfigToStream( doc, out );
    TidyDocFree( doc, out );
    return status;
}